

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
* __thiscall fasttext::Meter::getPositiveCounts(Meter *this,int32_t labelId)

{
  undefined1 uVar1;
  size_type sVar2;
  reference this_00;
  undefined4 in_EDX;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_RDI;
  double gold;
  double score;
  const_reverse_iterator it;
  double lastScore;
  uint64_t falsePositives;
  uint64_t truePositives;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *v;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *positiveCounts;
  pointer in_stack_ffffffffffffff38;
  pointer in_stack_ffffffffffffff40;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
  *in_stack_ffffffffffffff48;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *this_01;
  undefined7 in_stack_ffffffffffffff50;
  pair<unsigned_long,_unsigned_long> local_90;
  double local_80;
  pointer local_78;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> local_70;
  unsigned_long local_58;
  unsigned_long local_50 [3];
  undefined1 local_38 [28];
  int32_t labelId_00;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar3;
  
  labelId_00 = (int32_t)((ulong)stack0xffffffffffffffe0 >> 0x20);
  uVar3 = (uint)in_stack_ffffffffffffffe8;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)0x1dc505);
  scoreVsTrue((Meter *)CONCAT44(in_EDX,uVar3),labelId_00);
  unique0x00005300 = local_38;
  local_50[0] = 0;
  local_58 = 0;
  local_70.super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc000000000000000;
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::rbegin
            (in_stack_ffffffffffffff48);
  while( true ) {
    this_01 = &local_70;
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::rend(this_01);
    uVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                             *)in_stack_ffffffffffffff40,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                             *)in_stack_ffffffffffffff38);
    if (!(bool)uVar1) break;
    in_stack_ffffffffffffff40 =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                       *)in_stack_ffffffffffffff40);
    local_78 = (pointer)(double)in_stack_ffffffffffffff40->first;
    in_stack_ffffffffffffff38 =
         std::
         reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                       *)in_stack_ffffffffffffff40);
    local_80 = (double)in_stack_ffffffffffffff38->second;
    if ((double)local_78 < 0.0) break;
    if ((local_80 != 1.0) || (NAN(local_80))) {
      local_58 = local_58 + 1;
    }
    else {
      local_50[0] = local_50[0] + 1;
    }
    if ((((double)local_78 !=
          (double)local_70.
                  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) ||
        (NAN((double)local_78) ||
         NAN((double)local_70.
                     super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage))) ||
       (sVar2 = std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::size(in_RDI), sVar2 == 0)) {
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long&,unsigned_long&>
                ((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)CONCAT17(uVar1,in_stack_ffffffffffffff50),(unsigned_long *)this_01,
                 (unsigned_long *)in_stack_ffffffffffffff40);
    }
    else {
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                (&local_90,local_50,&local_58);
      this_00 = std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        *)in_stack_ffffffffffffff40);
      std::pair<unsigned_long,_unsigned_long>::operator=(this_00,&local_90);
    }
    local_70.super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::pair<float,_float>_*,_std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
                  *)in_stack_ffffffffffffff40);
  }
  uVar3 = 0x1000000;
  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::~vector
            ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffff50));
  if ((uVar3 & 0x1000000) == 0) {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)CONCAT17(uVar1,in_stack_ffffffffffffff50));
  }
  return in_RDI;
}

Assistant:

std::vector<std::pair<uint64_t, uint64_t>> Meter::getPositiveCounts(
    int32_t labelId) const {
  std::vector<std::pair<uint64_t, uint64_t>> positiveCounts;

  const auto& v = scoreVsTrue(labelId);
  uint64_t truePositives = 0;
  uint64_t falsePositives = 0;
  double lastScore = falseNegativeScore - 1.0;

  for (auto it = v.rbegin(); it != v.rend(); ++it) {
    double score = it->first;
    double gold = it->second;
    if (score < 0) { // only reachable recall
      break;
    }
    if (gold == 1.0) {
      truePositives++;
    } else {
      falsePositives++;
    }
    if (score == lastScore && positiveCounts.size()) { // squeeze tied scores
      positiveCounts.back() = {truePositives, falsePositives};
    } else {
      positiveCounts.emplace_back(truePositives, falsePositives);
    }
    lastScore = score;
  }

  return positiveCounts;
}